

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

bool __thiscall helics::Federate::isQueryCompleted(Federate *this,QueryId *queryIndex)

{
  uint uVar1;
  _Rb_tree_header *p_Var2;
  future_status fVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  handle asyncInfo;
  duration<long,_std::ratio<1L,_1L>_> local_38;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *local_30;
  unique_lock<std::mutex> local_28;
  
  if (this->singleThreadFederate == false) {
    local_30 = (this->asyncCallInfo)._M_t.
               super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               .
               super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
               ._M_head_impl;
    local_28._M_device = &local_30->m_mutex;
    local_28._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_28);
    local_28._M_owns = true;
    uVar1 = queryIndex->ivalue;
    p_Var2 = (_Rb_tree_header *)((long)&(local_30->m_obj).inFlightQueries._M_t + 8);
    p_Var4 = (_Base_ptr)p_Var2;
    for (p_Var5 = *(_Base_ptr *)((long)&(local_30->m_obj).inFlightQueries._M_t + 0x10);
        p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < (int)uVar1])
    {
      if ((int)uVar1 <= (int)p_Var5[1]._M_color) {
        p_Var4 = p_Var5;
      }
    }
    p_Var5 = (_Base_ptr)p_Var2;
    if (((_Rb_tree_header *)p_Var4 != p_Var2) &&
       (p_Var5 = p_Var4, (int)uVar1 < (int)p_Var4[1]._M_color)) {
      p_Var5 = (_Base_ptr)p_Var2;
    }
    if ((_Rb_tree_header *)p_Var5 == p_Var2) {
      bVar6 = false;
    }
    else {
      local_38.__r = 0;
      fVar3 = std::__basic_future<std::__cxx11::string>::wait_for<long,std::ratio<1l,1l>>
                        ((__basic_future<std::__cxx11::string> *)&p_Var5[1]._M_parent,&local_38);
      bVar6 = fVar3 == ready;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Federate::isQueryCompleted(QueryId queryIndex) const  // NOLINT
{
    if (singleThreadFederate) {
        return false;
    }
    auto asyncInfo = asyncCallInfo->lock();
    auto fnd = asyncInfo->inFlightQueries.find(queryIndex.value());
    if (fnd != asyncInfo->inFlightQueries.end()) {
        return (fnd->second.wait_for(std::chrono::seconds(0)) == std::future_status::ready);
    }
    return false;
}